

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepCommand.h
# Opt level: O0

void __thiscall SleepCommand::~SleepCommand(SleepCommand *this)

{
  SleepCommand *this_local;
  
  ~SleepCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~SleepCommand() override = default;